

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn;
  char *pcVar2;
  char *__s;
  curl_off_t cVar3;
  smb_header *h;
  curl_pp_transfer cVar4;
  void *pvVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  smb_request *psVar17;
  ulong uVar18;
  size_t upload_size;
  void *msg;
  _Bool *local_480;
  smb_request *local_478;
  Curl_easy *local_470;
  undefined1 local_464;
  undefined1 uStack_463;
  undefined1 local_462;
  undefined2 uStack_461;
  undefined1 uStack_45f;
  undefined1 uStack_45e;
  undefined1 uStack_45d;
  undefined1 uStack_45c;
  undefined1 uStack_45b;
  undefined1 uStack_45a;
  undefined2 uStack_459;
  char acStack_457 [3];
  undefined2 uStack_454;
  undefined1 uStack_452;
  undefined1 uStack_451;
  undefined1 uStack_450;
  undefined4 uStack_44f;
  undefined1 uStack_44b;
  undefined1 uStack_44a;
  undefined5 uStack_449;
  undefined1 uStack_444;
  undefined1 uStack_443;
  undefined2 uStack_442;
  int iStack_440;
  undefined1 uStack_43c;
  undefined8 uStack_43b;
  undefined2 local_433;
  char local_431 [1025];
  
  conn = data->conn;
  psVar17 = (data->req).p.smb;
  msg = (void *)0x0;
  if ((((data->state).field_0x746 & 2) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar17->state == SMB_REQUESTING) {
    pcVar2 = (conn->host).name;
    local_480 = done;
    local_478 = psVar17;
    local_470 = data;
    sVar10 = strlen(pcVar2);
    __s = (char *)(conn->proto).rtspc.buf.toobig;
    sVar11 = strlen(__s);
    uVar18 = sVar11 + sVar10 + 10;
    if (0x400 < uVar18) {
      CVar8 = CURLE_FILESIZE_EXCEEDED;
      goto LAB_0014fbf0;
    }
    uStack_45e = 0;
    local_462 = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    local_464 = 4;
    uStack_463 = 0xff;
    uStack_45d = 0;
    uStack_45c = 0;
    acStack_457[0] = '\0';
    uStack_459 = 0x5c5c;
    strcpy(acStack_457,pcVar2);
    sVar12 = strlen(pcVar2);
    (acStack_457 + sVar12)[0] = '\\';
    (acStack_457 + sVar12)[1] = '\0';
    strcpy(acStack_457 + sVar12 + 1,__s);
    sVar13 = strlen(__s);
    data = local_470;
    builtin_strncpy(acStack_457 + sVar13 + sVar12 + 2,"????",4);
    *(undefined2 *)(&uStack_451 + sVar13 + sVar12) = 0x3f;
    uStack_45b = (undefined1)uVar18;
    uStack_45a = (undefined1)(uVar18 >> 8);
    CVar8 = smb_send_message(local_470,'u',&local_464,sVar11 + sVar10 + 0x15);
    if (CVar8 != CURLE_OK) goto LAB_0014fbf0;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
    psVar17 = local_478;
    done = local_480;
  }
  CVar8 = smb_send_and_recv(data,&msg);
  pvVar5 = msg;
  if ((CVar8 != CURLE_OK) && (CVar8 != CURLE_AGAIN)) {
LAB_0014fbf0:
    Curl_conncontrol(conn,1);
    return CVar8;
  }
  CVar8 = CURLE_OK;
  if (msg == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar17->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)msg + 9) == 0) {
      psVar17->tid = *(unsigned_short *)((long)msg + 0x1c);
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      pcVar2 = ((data->req).p.file)->freepath;
      sVar10 = strlen(pcVar2);
      if (sVar10 + 1 < 0x401) {
        local_462 = 0;
        uStack_461 = 0;
        uStack_45f = 0;
        uStack_45c = 0;
        uStack_45b = 0;
        uStack_45a = 0;
        uStack_459 = 0;
        acStack_457[0] = '\0';
        acStack_457[1] = 0;
        acStack_457[2] = 0;
        uStack_43c = 0;
        uStack_43b = 0;
        uStack_450 = 0;
        uStack_44f = 0;
        uStack_44b = 0;
        uStack_44a = 0;
        uStack_449 = 0;
        local_464 = 0x18;
        uStack_463 = 0xff;
        uStack_45e = (undefined1)sVar10;
        uStack_45d = (undefined1)(sVar10 >> 8);
        uStack_444 = 7;
        uStack_443 = 0;
        uStack_442 = 0;
        uVar15 = *(uint *)&(data->state).field_0x744 >> 0x11 & 1;
        iStack_440 = uVar15 * 4 + 1;
        uStack_454 = 0;
        uStack_452 = 0;
        uStack_451 = (undefined1)((uVar15 - 2) * 0x40000000 >> 0x18);
        local_433 = (undefined2)(sVar10 + 1);
        strcpy(local_431,pcVar2);
        CVar9 = smb_send_message(data,0xa2,&local_464,sVar10 + 0x34);
      }
      else {
        CVar9 = CURLE_FILESIZE_EXCEEDED;
      }
      cVar4 = PPTRANSFER_NONE;
      goto LAB_0015003b;
    }
    CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)msg + 9) == 0x50001) {
      CVar9 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar17->result = CVar9;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)msg + 9) == 0) && (99 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      psVar17->fid = *(unsigned_short *)((long)msg + 0x2a);
      (data->req).offset = 0;
      if (((data->state).field_0x746 & 2) != 0) {
        cVar3 = (data->state).infilesize;
        (data->req).size = cVar3;
        Curl_pgrsSetUploadSize(data,cVar3);
        lVar16 = (data->req).size;
        lVar14 = (data->req).bytecount;
LAB_0014fec8:
        (conn->proto).ftpc.pp.sendbuf.toobig = 0;
        upload_size = lVar16 - lVar14;
        psVar17 = (data->req).p.smb;
        cVar3 = (data->req).offset;
        if (0x7ffe < (long)upload_size) {
          upload_size = 0x7fff;
        }
        h = (smb_header *)(data->conn->proto).ftpc.pp.response_time;
        *(undefined8 *)&h->uid = 0;
        *(undefined8 *)h[1].magic = 0;
        *(undefined8 *)((long)&h[1].status + 3) = 0;
        *(undefined8 *)(h[1].signature + 2) = 0;
        h->pid_high = 0;
        h->signature[0] = '\0';
        h->signature[1] = '\0';
        h->signature[2] = '\0';
        h->signature[3] = '\0';
        h->signature[4] = '\0';
        h->signature[5] = '\0';
        *(undefined8 *)(h->signature + 6) = 0;
        h[1].tid = 0;
        h[1].pid = 0;
        h->nbt_type = '\0';
        h->nbt_flags = '\0';
        h->nbt_length = 0;
        h->magic[0] = '\0';
        h->magic[1] = '\0';
        h->magic[2] = '\0';
        h->magic[3] = '\0';
        h->command = '\0';
        h->status = 0;
        h->flags = '\0';
        h->flags2 = 0;
        h[1].nbt_type = '\x0e';
        h[1].nbt_flags = 0xff;
        *(unsigned_short *)(h[1].magic + 1) = psVar17->fid;
        *(int *)(h[1].magic + 3) = (int)cVar3;
        *(int *)(h[1].signature + 7) = (int)((ulong)cVar3 >> 0x20);
        *(short *)(h[1].signature + 3) = (short)upload_size;
        h[1].signature[5] = '@';
        h[1].signature[6] = '\0';
        *(short *)((long)&h[1].tid + 1) = (short)upload_size + 1;
        smb_format_message(data,h,'/',upload_size + 0x20);
        CVar9 = smb_send(data,0x44,upload_size);
        cVar4 = 4;
        goto LAB_0015003b;
      }
      lVar16 = *(long *)((long)msg + 0x5c);
      (data->req).size = lVar16;
      if (lVar16 < 0) {
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
        goto LAB_0014fff7;
      }
      Curl_pgrsSetDownloadSize(data,lVar16);
      if (((data->set).field_0x8ca & 0x80) != 0) {
        (data->info).filetime = (*(long *)((long)pvVar5 + 0x48) + -0x19db1ded53e8000) / 10000000;
      }
LAB_0014ff95:
      (conn->proto).ftpc.pp.sendbuf.toobig = 0;
      cVar3 = (data->req).offset;
      uStack_452 = 0;
      uStack_451 = 0;
      uStack_450 = 0;
      uStack_44b = 0;
      uStack_44a = 0;
      local_462 = 0;
      uStack_461 = 0;
      acStack_457[2] = 0;
      uStack_454 = 0;
      local_464 = 0xc;
      uStack_463 = 0xff;
      uVar6 = ((data->req).p.smb)->fid;
      uStack_45f = (undefined1)uVar6;
      uStack_45e = (undefined1)(uVar6 >> 8);
      uStack_45d = (undefined1)cVar3;
      uStack_45c = (undefined1)((ulong)cVar3 >> 8);
      uStack_45b = (undefined1)((ulong)cVar3 >> 0x10);
      uStack_45a = (undefined1)((ulong)cVar3 >> 0x18);
      uStack_44f = (undefined4)((ulong)cVar3 >> 0x20);
      uStack_459 = 0x8000;
      acStack_457[0] = '\0';
      acStack_457[1] = 0x80;
      CVar9 = smb_send_message(data,'.',&local_464,0x1b);
      cVar4 = PPTRANSFER_NONE|PPTRANSFER_INFO;
      goto LAB_0015003b;
    }
    CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
    if (*(int *)((long)msg + 9) == 0x50001) {
      CVar9 = CURLE_REMOTE_ACCESS_DENIED;
    }
    psVar17->result = CVar9;
  case SMB_CLOSE:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    local_462 = 0;
    local_464 = 0;
    uStack_463 = 0;
    CVar9 = smb_send_message(data,'q',&local_464,3);
    cVar4 = 6;
    goto LAB_0015003b;
  case SMB_DOWNLOAD:
    CVar9 = CURLE_RECV_ERROR;
    if ((*(int *)((long)msg + 9) == 0) && (0x31 < (conn->proto).ftpc.pp.sendbuf.toobig)) {
      uVar6 = Curl_read16_le((uchar *)((long)msg + 0x2f));
      uVar7 = Curl_read16_le((uchar *)((long)pvVar5 + 0x31));
      if (uVar6 == 0) {
        uVar18 = 0;
LAB_0014ff84:
        pcVar1 = &(data->req).offset;
        *pcVar1 = *pcVar1 + uVar18;
        if (-1 < (short)uVar6) goto LAB_00150000;
        goto LAB_0014ff95;
      }
      uVar18 = (ulong)uVar6;
      if ((conn->proto).ftpc.pp.sendbuf.toobig < uVar18 + uVar7 + 4) {
        Curl_failf(data,"Invalid input packet");
      }
      else {
        CVar9 = Curl_client_write(data,1,(char *)((long)pvVar5 + (ulong)uVar7 + 4),uVar18);
        if (CVar9 == CURLE_OK) goto LAB_0014ff84;
      }
    }
LAB_0014fff7:
    psVar17->result = CVar9;
    goto LAB_00150000;
  case SMB_UPLOAD:
    CVar9 = CURLE_UPLOAD_FAILED;
    if ((*(int *)((long)msg + 9) != 0) || ((conn->proto).ftpc.pp.sendbuf.toobig < 0x2a))
    goto LAB_0014fff7;
    uVar6 = Curl_read16_le((uchar *)((long)msg + 0x29));
    lVar16 = (data->req).bytecount + (ulong)uVar6;
    (data->req).bytecount = lVar16;
    pcVar1 = &(data->req).offset;
    *pcVar1 = *pcVar1 + (ulong)uVar6;
    Curl_pgrsSetUploadCounter(data,lVar16);
    lVar16 = (data->req).size;
    lVar14 = (data->req).bytecount;
    if (lVar14 < lVar16) goto LAB_0014fec8;
LAB_00150000:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    uStack_45d = 0;
    uStack_45c = 0;
    uStack_461 = 0;
    uStack_45f = 0;
    uStack_45e = 0;
    local_464 = 3;
    uVar6 = ((data->req).p.smb)->fid;
    uStack_463 = (undefined1)uVar6;
    local_462 = (undefined1)(uVar6 >> 8);
    CVar9 = smb_send_message(data,'\x04',&local_464,9);
    cVar4 = 5;
    goto LAB_0015003b;
  case SMB_TREE_DISCONNECT:
    CVar9 = psVar17->result;
    break;
  default:
    (conn->proto).ftpc.pp.sendbuf.toobig = 0;
    return CURLE_OK;
  }
  (conn->proto).ftpc.pp.sendbuf.toobig = 0;
  *done = true;
  cVar4 = 7;
LAB_0015003b:
  if (CVar9 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar4;
  }
  else {
    Curl_conncontrol(conn,1);
    CVar8 = CVar9;
  }
  return CVar8;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We do not care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}